

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptexnumber.cpp
# Opt level: O0

string * usage(string *name)

{
  string *in_RDI;
  string *result;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  string local_58 [32];
  string local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  
  __rhs = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  std::operator+(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::operator+(in_stack_ffffffffffffff98,(char *)__rhs);
  std::__cxx11::string::operator+=((string *)in_RDI,local_38);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::operator+=
            ((string *)in_RDI,
             "Renumbers LaTeX equations. The program reads from the standard input and writes to the standard output.\n"
            );
  std::__cxx11::string::operator+=
            ((string *)in_RDI,"Warnings and errors are output to the standard error stream.");
  return __rhs;
}

Assistant:

std::string usage(const std::string& name) {
    std::string result;
    result += "Usage: " + name +
              " <pattern> <replacement> [ignore_comments ON(default)/OFF] "
              "[log_file]\n\n";
    result += "Renumbers LaTeX equations. "
              "The program reads from the standard input and writes to the "
              "standard output.\n";
    result += "Warnings and errors are output to the standard error stream.";
    return result;
}